

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExtract.c
# Opt level: O0

void Abc_NtkTraverseSupersXor_rec(Abc_ShaMan_t *p,Abc_Obj_t *pObj,Vec_Ptr_t *vInputs)

{
  Vec_Int_t *p_00;
  int iVar1;
  int iVar2;
  uint Var;
  word wVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  Vec_Int_t *local_40;
  Vec_Int_t *vInput;
  word Num;
  int fCompl;
  int k;
  Vec_Wrd_t *vSuper;
  Vec_Ptr_t *vInputs_local;
  Abc_Obj_t *pObj_local;
  Abc_ShaMan_t *p_local;
  
  vSuper = (Vec_Wrd_t *)vInputs;
  vInputs_local = (Vec_Ptr_t *)pObj;
  pObj_local = (Abc_Obj_t *)p;
  iVar1 = Abc_NodeIsTravIdCurrent(pObj);
  if (iVar1 == 0) {
    Abc_NodeSetTravIdCurrent((Abc_Obj_t *)vInputs_local);
    iVar1 = Abc_ObjIsCi((Abc_Obj_t *)vInputs_local);
    if (iVar1 == 0) {
      iVar1 = Abc_ObjIsNode((Abc_Obj_t *)vInputs_local);
      if (iVar1 == 0) {
        __assert_fail("Abc_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcExtract.c"
                      ,0xf4,
                      "void Abc_NtkTraverseSupersXor_rec(Abc_ShaMan_t *, Abc_Obj_t *, Vec_Ptr_t *)")
        ;
      }
      iVar1 = Abc_NodeIsExorType((Abc_Obj_t *)vInputs_local);
      pAVar4 = pObj_local;
      if (iVar1 == 0) {
        pAVar5 = Abc_ObjFanin0((Abc_Obj_t *)vInputs_local);
        Abc_NtkTraverseSupersXor_rec((Abc_ShaMan_t *)pAVar4,pAVar5,(Vec_Ptr_t *)vSuper);
        pAVar4 = pObj_local;
        pAVar5 = Abc_ObjFanin1((Abc_Obj_t *)vInputs_local);
        Abc_NtkTraverseSupersXor_rec((Abc_ShaMan_t *)pAVar4,pAVar5,(Vec_Ptr_t *)vSuper);
      }
      else {
        _fCompl = Abc_NtkShareSuperXor
                            ((Abc_Obj_t *)vInputs_local,(int *)&Num,&(pObj_local->vFanouts).nCap);
        iVar1 = Vec_WrdSize(_fCompl);
        if ((iVar1 < 2) || (iVar1 = Vec_WrdSize(_fCompl), *(int *)&pObj_local->pNtk <= iVar1)) {
          for (Num._4_4_ = 0; iVar1 = Num._4_4_, iVar2 = Vec_WrdSize(_fCompl), iVar1 < iVar2;
              Num._4_4_ = Num._4_4_ + 1) {
            wVar3 = Vec_WrdEntry(_fCompl,Num._4_4_);
            iVar1 = (int)wVar3;
            local_40 = (Vec_Int_t *)Vec_PtrEntry((Vec_Ptr_t *)vSuper,iVar1);
            if (local_40 == (Vec_Int_t *)0x0) {
              local_40 = Vec_IntAlloc(10);
              iVar2 = Abc_Var2Lit(iVar1,0);
              Vec_IntPush(local_40,iVar2);
              pAVar4 = Abc_NtkObj((Abc_Ntk_t *)pObj_local->pNext,iVar1);
              iVar2 = Abc_ObjLevel(pAVar4);
              Vec_IntPush(local_40,iVar2);
              iVar2 = Vec_IntSize(local_40);
              if (iVar2 != 2) {
                __assert_fail("SHARE_NUM == Vec_IntSize(vInput)",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcExtract.c"
                              ,0x105,
                              "void Abc_NtkTraverseSupersXor_rec(Abc_ShaMan_t *, Abc_Obj_t *, Vec_Ptr_t *)"
                             );
              }
              Vec_PtrWriteEntry((Vec_Ptr_t *)vSuper,iVar1,local_40);
            }
            iVar1 = Vec_IntSize(*(Vec_Int_t **)&pObj_local->vFanins);
            Vec_IntPush(local_40,iVar1);
          }
          p_00 = *(Vec_Int_t **)&pObj_local->vFanins;
          Var = Abc_ObjId((Abc_Obj_t *)vInputs_local);
          iVar1 = Abc_Var2Lit(Var,(int)Num);
          Vec_IntPush(p_00,iVar1);
        }
        for (Num._4_4_ = 0; iVar1 = Num._4_4_, iVar2 = Vec_WrdSize(_fCompl), iVar1 < iVar2;
            Num._4_4_ = Num._4_4_ + 1) {
          wVar3 = Vec_WrdEntry(_fCompl,Num._4_4_);
          pAVar4 = pObj_local;
          pAVar5 = Abc_NtkObj((Abc_Ntk_t *)pObj_local->pNext,(int)wVar3);
          Abc_NtkTraverseSupersXor_rec((Abc_ShaMan_t *)pAVar4,pAVar5,(Vec_Ptr_t *)vSuper);
        }
        Vec_WrdFree(_fCompl);
      }
    }
  }
  return;
}

Assistant:

void Abc_NtkTraverseSupersXor_rec( Abc_ShaMan_t * p, Abc_Obj_t * pObj, Vec_Ptr_t * vInputs )
{
    if ( Abc_NodeIsTravIdCurrent( pObj ) )
        return;
    Abc_NodeSetTravIdCurrent( pObj );
    if ( Abc_ObjIsCi(pObj) )
        return;
    assert( Abc_ObjIsNode(pObj) );
    if ( Abc_NodeIsExorType(pObj) )
    {
        Vec_Wrd_t * vSuper;
        int k, fCompl;
        word Num;
        vSuper = Abc_NtkShareSuperXor( pObj, &fCompl, &p->nFoundGates );
        if ( Vec_WrdSize(vSuper) <= 1 || Vec_WrdSize(vSuper) >= p->nMultiSize )
        {
            Vec_WrdForEachEntry( vSuper, Num, k )
            {
                Vec_Int_t * vInput = (Vec_Int_t *)Vec_PtrEntry( vInputs, (int)Num );
                if ( vInput == NULL )
                {
                    vInput = Vec_IntAlloc( 10 );
                    Vec_IntPush( vInput, Abc_Var2Lit((int)Num, 0) );
                    Vec_IntPush( vInput, Abc_ObjLevel(Abc_NtkObj(p->pNtk, (int)Num)) );
                    assert( SHARE_NUM == Vec_IntSize(vInput) );
                    Vec_PtrWriteEntry( vInputs, (int)Num, vInput );
                }
                Vec_IntPush( vInput, Vec_IntSize(p->vObj2Lit) );
            }
            Vec_IntPush( p->vObj2Lit, Abc_Var2Lit(Abc_ObjId(pObj), fCompl) );
        }
        // call recursively
        Vec_WrdForEachEntry( vSuper, Num, k )
            Abc_NtkTraverseSupersXor_rec( p, Abc_NtkObj(p->pNtk, (int)Num), vInputs );
        Vec_WrdFree( vSuper );
    }
    else
    {
        Abc_NtkTraverseSupersXor_rec( p, Abc_ObjFanin0(pObj), vInputs );
        Abc_NtkTraverseSupersXor_rec( p, Abc_ObjFanin1(pObj), vInputs );
    }
}